

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,Arguments *other)

{
  InternalFlags other_00;
  Arguments *other_local;
  Arguments *this_local;
  
  (this->_flags)._value = (other->_flags)._value;
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  std::__cxx11::string::string((string *)&this->_prefix,(string *)&other->_prefix);
  std::__cxx11::string::string((string *)&this->_command,(string *)&other->_command);
  std::__cxx11::string::string((string *)&this->_help,(string *)&other->_help);
  Containers::
  Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
  ::Array(&this->_entries,&other->_entries);
  Containers::
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  ::Array(&this->_values,&other->_values);
  Containers::
  Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
  ::Array(&this->_arrayValues);
  Containers::
  Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
  ::Array(&this->_skippedPrefixes,&other->_skippedPrefixes);
  Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::Array
            (&this->_booleans,&other->_booleans);
  this->_parseErrorCallback = other->_parseErrorCallback;
  this->_parseErrorCallbackState = other->_parseErrorCallbackState;
  other_00 = Utility::operator~(Parsed);
  Containers::EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::operator&=
            (&other->_flags,
             (EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)__xff_>)
             other_00._value);
  return;
}

Assistant:

Arguments::Arguments(Arguments&& other) noexcept: _flags{std::move(other._flags)}, _prefix{std::move(other._prefix)}, _command{std::move(other._command)}, _help{std::move(other._help)}, _entries{std::move(other._entries)}, _values{std::move(other._values)}, _skippedPrefixes{std::move(other._skippedPrefixes)}, _booleans{std::move(other._booleans)}, _parseErrorCallback{std::move(other._parseErrorCallback)}, _parseErrorCallbackState{std::move(other._parseErrorCallbackState)} {
    other._flags &= ~InternalFlag::Parsed;
}